

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void * voutlet_newsig(t_symbol *s)

{
  int iVar1;
  t_object *owner;
  _glist *p_Var2;
  _outlet *p_Var3;
  _inlet *p_Var4;
  t_voutlet *x;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(voutlet_class);
  p_Var2 = canvas_getcurrent();
  owner[1].te_g.g_pd = (t_pd)p_Var2;
  p_Var3 = canvas_addoutlet((_glist *)owner[1].te_g.g_pd,(t_pd *)owner,&s_signal);
  owner[1].te_g.g_next = (_gobj *)p_Var3;
  inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  p_Var4 = (_inlet *)getbytes(0);
  owner[1].te_outlet = (_outlet *)p_Var4;
  owner[1].te_inlet = p_Var4;
  *(undefined4 *)&owner[1].te_binbuf = 0;
  resample_init((t_resample *)&owner[2].te_inlet);
  iVar1 = symbol2resamplemethod(s);
  *(int *)&owner[2].te_inlet = iVar1;
  return owner;
}

Assistant:

static void *voutlet_newsig(t_symbol *s)
{
    t_voutlet *x = (t_voutlet *)pd_new(voutlet_class);
    x->x_canvas = canvas_getcurrent();
    x->x_parentoutlet = canvas_addoutlet(x->x_canvas,
        &x->x_obj.ob_pd, &s_signal);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    x->x_endbuf = x->x_buf = (t_sample *)getbytes(0);
    x->x_bufsize = 0;

    resample_init(&x->x_updown);

    /* this should be though over:
     * it might prove hard to provide consistency between labeled up- & downsampling methods
     * maybe indices would be better...
     *
     * up till now we provide several upsampling methods and 1 single downsampling method (no filtering !)
     */
    x->x_updown.method = symbol2resamplemethod(s);

    return (x);
}